

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::TestInvokerAsMethod<(anonymous_namespace)::____C_A_T_C_H____T_E_S_T____4>::invoke
          (TestInvokerAsMethod<(anonymous_namespace)::____C_A_T_C_H____T_E_S_T____4> *this)

{
  code *pcVar1;
  EventManager *pEVar2;
  ____C_A_T_C_H____T_E_S_T____4 obj;
  EntitiesFixture EStack_128;
  
  EntitiesFixture::EntitiesFixture(&EStack_128);
  pcVar1 = (code *)this->m_testAsMethod;
  pEVar2 = &EStack_128.super_EntityX.events + *(long *)&this->field_0x10;
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *(long *)pEVar2 + -1);
  }
  (*pcVar1)(pEVar2);
  if (EStack_128.created_entities.
      super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(EStack_128.created_entities.
                    super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  clara::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<entityx::BaseSystem>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<entityx::BaseSystem>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&EStack_128.super_EntityX.systems.systems_._M_h);
  entityx::EntityManager::~EntityManager(&EStack_128.super_EntityX.entities);
  entityx::EventManager::~EventManager((EventManager *)&EStack_128);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }